

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O2

bool Limonp::Logger::LoggingF(uint level,char *fileName,int lineNo,string *fmt,...)

{
  char in_AL;
  bool bVar1;
  int iVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string msg;
  va_list ap;
  string local_128;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  uVar3 = 0x100;
  local_c8 = in_R8;
  local_c0 = in_R9;
  while( true ) {
    std::__cxx11::string::resize((ulong)&local_128);
    local_f8 = local_e8;
    local_108 = 0x3000000020;
    local_100 = &stack0x00000008;
    iVar2 = vsnprintf(local_128._M_dataplus._M_p,(ulong)uVar3,(fmt->_M_dataplus)._M_p,&local_108);
    if (iVar2 < (int)uVar3 && -1 < iVar2) break;
    uVar3 = uVar3 * 2;
    if (-1 < iVar2) {
      uVar3 = iVar2 + 1;
    }
  }
  std::__cxx11::string::resize((ulong)&local_128);
  bVar1 = Logging(level,&local_128,fileName,lineNo);
  std::__cxx11::string::~string((string *)&local_128);
  return bVar1;
}

Assistant:

static bool LoggingF(uint level, const char* fileName, int lineNo, const string& fmt, ...)
            {
                int size = 256;
                string msg;
                va_list ap;
                while (1) {
                    msg.resize(size);
                    va_start(ap, fmt);
                    int n = vsnprintf((char *)msg.c_str(), size, fmt.c_str(), ap);
                    va_end(ap);
                    if (n > -1 && n < size) {
                        msg.resize(n);
                        break;
                    }
                    if (n > -1)
                      size = n + 1;
                    else
                      size *= 2;
                }
                return Logging(level, msg, fileName, lineNo);
            }